

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

xmlChar * xmlTextReaderNamespaceUri(xmlTextReaderPtr reader)

{
  xmlNodePtr pxVar1;
  xmlChar *pxVar2;
  
  if ((reader != (xmlTextReaderPtr)0x0) && (reader->node != (xmlNodePtr)0x0)) {
    pxVar1 = reader->node;
    if (reader->curnode != (xmlNodePtr)0x0) {
      pxVar1 = reader->curnode;
    }
    if (pxVar1->type - XML_ELEMENT_NODE < 2) {
      if (pxVar1->ns != (xmlNs *)0x0) {
        pxVar2 = xmlStrdup(pxVar1->ns->href);
        return pxVar2;
      }
    }
    else if (pxVar1->type == XML_NAMESPACE_DECL) {
      pxVar2 = xmlStrdup((xmlChar *)"http://www.w3.org/2000/xmlns/");
      return pxVar2;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlTextReaderNamespaceUri(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    if ((reader == NULL) || (reader->node == NULL))
	return(NULL);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;
    if (node->type == XML_NAMESPACE_DECL)
	return(xmlStrdup(BAD_CAST "http://www.w3.org/2000/xmlns/"));
    if ((node->type != XML_ELEMENT_NODE) &&
	(node->type != XML_ATTRIBUTE_NODE))
	return(NULL);
    if (node->ns != NULL)
	return(xmlStrdup(node->ns->href));
    return(NULL);
}